

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TFunction * __thiscall
glslang::TParseContext::findFunction120
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  TFunction *pTVar2;
  TType *pTVar3;
  TIntermediate *pTVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  TBasicType TVar10;
  TBasicType TVar11;
  undefined4 extraout_var;
  TSymbol *pTVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppTVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar14;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  bool bVar15;
  TFunction *pTVar16;
  TFunction *pTVar17;
  uint uVar18;
  TVector<const_glslang::TFunction_*> local_50;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar12 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var,iVar8),builtIn,(bool *)0x0,
                               (int *)0x0);
  if (pTVar12 != (TSymbol *)0x0) {
    iVar8 = (*pTVar12->_vptr_TSymbol[7])(pTVar12);
    return (TFunction *)CONCAT44(extraout_var_00,iVar8);
  }
  local_50.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_50.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.
  super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  TSymbolTable::findFunctionNameList
            (pTVar1,(TString *)CONCAT44(extraout_var_01,iVar8),&local_50,builtIn);
  if (local_50.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.
      super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      .
      super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppTVar13 = local_50.
               super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               .
               super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pTVar16 = (TFunction *)0x0;
    do {
      pTVar2 = *ppTVar13;
      iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
      iVar9 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
      pTVar17 = pTVar16;
      if (iVar8 == iVar9) {
        iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
        if (0 < iVar8) {
          bVar15 = true;
          uVar18 = 0;
          do {
            iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
            pTVar3 = *(TType **)(CONCAT44(extraout_var_02,iVar8) + 8);
            iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar18);
            bVar5 = TType::operator==(pTVar3,*(TType **)(CONCAT44(extraout_var_03,iVar8) + 8));
            if (!bVar5) {
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
              cVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar8) + 8) + 0xe8))();
              if (cVar6 != '\0') goto LAB_0042edaf;
              iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar18);
              cVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar8) + 8) + 0xe8))();
              if (cVar6 != '\0') goto LAB_0042edaf;
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
              pTVar3 = *(TType **)(CONCAT44(extraout_var_06,iVar8) + 8);
              iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar18);
              bVar5 = TType::sameElementShape
                                (pTVar3,*(TType **)(CONCAT44(extraout_var_07,iVar8) + 8),(int *)0x0,
                                 (int *)0x0);
              if (!bVar5) goto LAB_0042edaf;
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
              lVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar8) + 8) + 0x50))();
              bVar5 = bVar15;
              if (((*(uint *)(lVar14 + 8) & 0x7f) < 0x14) &&
                 ((0xd0000U >> (*(uint *)(lVar14 + 8) & 0x1f) & 1) != 0)) {
                pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar18);
                TVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar8) + 8) + 0x38))();
                iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
                TVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_10,iVar8) + 8) + 0x38))();
                bVar7 = TIntermediate::canImplicitlyPromote(pTVar4,TVar10,TVar11,EOpNull);
                bVar5 = false;
                if (bVar7) {
                  bVar5 = bVar15;
                }
              }
              iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
              lVar14 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar8) + 8) + 0x50))();
              bVar15 = bVar5;
              if ((*(uint *)(lVar14 + 8) & 0x7f) - 0x11 < 2) {
                pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar18);
                TVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_12,iVar8) + 8) + 0x38))();
                iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar18);
                TVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_13,iVar8) + 8) + 0x38))();
                bVar7 = TIntermediate::canImplicitlyPromote(pTVar4,TVar10,TVar11,EOpNull);
                bVar15 = false;
                if (bVar7) {
                  bVar15 = bVar5;
                }
              }
              if (!bVar15) break;
            }
            uVar18 = uVar18 + 1;
            iVar8 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
          } while ((int)uVar18 < iVar8);
          if (!bVar15) goto LAB_0042edaf;
        }
        pTVar17 = pTVar2;
        if (pTVar16 != (TFunction *)0x0) {
          iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "ambiguous function signature match: multiple signatures match under implicit type conversion"
                     ,*(undefined8 *)(CONCAT44(extraout_var_14,iVar8) + 8),"");
          pTVar17 = pTVar16;
        }
      }
LAB_0042edaf:
      ppTVar13 = ppTVar13 + 1;
      pTVar16 = pTVar17;
    } while (ppTVar13 !=
             local_50.
             super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             .
             super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (pTVar17 != (TFunction *)0x0) {
      return pTVar17;
    }
  }
  iVar8 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"no matching overloaded function found",
             *(undefined8 *)(CONCAT44(extraout_var_15,iVar8) + 8),"");
  return (TFunction *)0x0;
}

Assistant:

const TFunction* TParseContext::findFunction120(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // exact match not found, look through a list of overloaded functions of the same name

    // "If no exact match is found, then [implicit conversions] will be applied to find a match. Mismatched types
    // on input parameters (in or inout or default) must have a conversion from the calling argument type to the
    // formal parameter type. Mismatched types on output parameters (out or inout) must have a conversion
    // from the formal parameter type to the calling argument type.  When argument conversions are used to find
    // a match, it is a semantic error if there are multiple ways to apply these conversions to make the call match
    // more than one function."

    const TFunction* candidate = nullptr;
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    for (auto it = candidateList.begin(); it != candidateList.end(); ++it) {
        const TFunction& function = *(*it);

        // to even be a potential match, number of arguments has to match
        if (call.getParamCount() != function.getParamCount())
            continue;

        bool possibleMatch = true;
        for (int i = 0; i < function.getParamCount(); ++i) {
            // same types is easy
            if (*function[i].type == *call[i].type)
                continue;

            // We have a mismatch in type, see if it is implicitly convertible

            if (function[i].type->isArray() || call[i].type->isArray() ||
                ! function[i].type->sameElementShape(*call[i].type))
                possibleMatch = false;
            else {
                // do direction-specific checks for conversion of basic type
                if (function[i].type->getQualifier().isParamInput()) {
                    if (! intermediate.canImplicitlyPromote(call[i].type->getBasicType(), function[i].type->getBasicType()))
                        possibleMatch = false;
                }
                if (function[i].type->getQualifier().isParamOutput()) {
                    if (! intermediate.canImplicitlyPromote(function[i].type->getBasicType(), call[i].type->getBasicType()))
                        possibleMatch = false;
                }
            }
            if (! possibleMatch)
                break;
        }
        if (possibleMatch) {
            if (candidate) {
                // our second match, meaning ambiguity
                error(loc, "ambiguous function signature match: multiple signatures match under implicit type conversion", call.getName().c_str(), "");
            } else
                candidate = &function;
        }
    }

    if (candidate == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

    return candidate;
}